

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  uint uVar1;
  int iVar2;
  ulong code;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t newSize;
  size_t oldSize;
  size_t hSize;
  size_t unusedSize;
  size_t ctableSize;
  size_t _var_err__;
  size_t maxBits;
  size_t largest;
  size_t largestEnd;
  ulong uStack_70;
  uint maxSymbolValueEnd;
  size_t largestBegin;
  ulong uStack_60;
  uint maxSymbolValueBegin;
  size_t largestTotal;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  HUF_compress_tables_t *table;
  uint huffLog_local;
  uint maxSymbolValue_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  table._0_4_ = huffLog;
  table._4_4_ = maxSymbolValue;
  _huffLog_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstSize;
  dstSize_local = (size_t)dst;
  ostart = (BYTE *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  oend = (BYTE *)dstSize_local;
  op = (BYTE *)(dstSize_local + (long)src_local);
  largestTotal = dstSize_local;
  if (wkspSize < 0x1f08) {
    dst_local = (void *)0xffffffffffffffbe;
  }
  else if (_huffLog_local == (void *)0x0) {
    dst_local = (void *)0x0;
  }
  else if (src_local == (void *)0x0) {
    dst_local = (void *)0x0;
  }
  else if (_huffLog_local < (void *)0x20001) {
    if ((uint)table < 0xd) {
      if (table._4_4_ < 0x100) {
        if (table._4_4_ == 0) {
          table._4_4_ = 0xff;
        }
        if ((uint)table == 0) {
          table._0_4_ = 0xb;
        }
        if ((((flags & 4U) == 0) || (repeat == (HUF_repeat *)0x0)) || (*repeat != HUF_repeat_valid))
        {
          if (((flags & 8U) != 0) && ((void *)0x9fff < _huffLog_local)) {
            uStack_60 = 0;
            largestBegin._4_4_ = table._4_4_;
            uVar1 = HIST_count_simple((uint *)ostart,(uint *)((long)&largestBegin + 4),
                                      (void *)srcSize_local,0x1000);
            uStack_70 = (ulong)uVar1;
            uVar1 = ERR_isError(uStack_70);
            if (uVar1 != 0) {
              return uStack_70;
            }
            uStack_60 = uStack_70 + uStack_60;
            largestEnd._4_4_ = table._4_4_;
            uVar1 = HIST_count_simple((uint *)ostart,(uint *)((long)&largestEnd + 4),
                                      (void *)((long)_huffLog_local + (srcSize_local - 0x1000)),
                                      0x1000);
            code = (ulong)uVar1;
            uVar1 = ERR_isError(code);
            if (uVar1 != 0) {
              return code;
            }
            uStack_60 = code + uStack_60;
            if (uStack_60 < 0x45) {
              return 0;
            }
          }
          pvVar3 = (void *)HIST_count_wksp((uint *)ostart,(uint *)((long)&table + 4),
                                           (void *)srcSize_local,(size_t)_huffLog_local,
                                           ostart + 0xc08,0x1000);
          uVar1 = ERR_isError((size_t)pvVar3);
          dst_local = pvVar3;
          if (uVar1 == 0) {
            if (pvVar3 == _huffLog_local) {
              *oend = *(BYTE *)srcSize_local;
              dst_local = (void *)0x1;
            }
            else if ((void *)(((ulong)_huffLog_local >> 7) + 4) < pvVar3) {
              if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
                 (iVar2 = HUF_validateCTable(oldHufTable,(uint *)ostart,table._4_4_), iVar2 == 0)) {
                *repeat = HUF_repeat_none;
              }
              if ((((flags & 4U) == 0) || (repeat == (HUF_repeat *)0x0)) ||
                 (*repeat == HUF_repeat_none)) {
                table._0_4_ = HUF_optimalTableLog((uint)table,(size_t)_huffLog_local,table._4_4_,
                                                  ostart + 0xc08,0x1300,(HUF_CElt *)(ostart + 0x400)
                                                  ,(uint *)ostart,flags);
                pvVar3 = (void *)HUF_buildCTable_wksp
                                           ((HUF_CElt *)(ostart + 0x400),(uint *)ostart,table._4_4_,
                                            (uint)table,ostart + 0xc08,0x1300);
                uVar1 = ERR_isError((size_t)pvVar3);
                dst_local = pvVar3;
                if (uVar1 == 0) {
                  table._0_4_ = (uint)pvVar3;
                  memset(ostart + (ulong)(table._4_4_ + 2) * 8 + 0x400,0,
                         (ulong)(table._4_4_ + 2) * -8 + 0x808);
                  pvVar3 = (void *)HUF_writeCTable_wksp
                                             ((void *)largestTotal,(size_t)src_local,
                                              (HUF_CElt *)(ostart + 0x400),table._4_4_,(uint)table,
                                              ostart + 0xc08,0x2ec);
                  uVar1 = ERR_isError((size_t)pvVar3);
                  dst_local = pvVar3;
                  if (uVar1 == 0) {
                    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
                      sVar4 = HUF_estimateCompressedSize(oldHufTable,(uint *)ostart,table._4_4_);
                      sVar5 = HUF_estimateCompressedSize
                                        ((HUF_CElt *)(ostart + 0x400),(uint *)ostart,table._4_4_);
                      if ((sVar4 <= (long)pvVar3 + sVar5) ||
                         (_huffLog_local <= (void *)((long)pvVar3 + 0xcU))) {
                        sVar4 = HUF_compressCTable_internal
                                          (oend,(BYTE *)largestTotal,op,(void *)srcSize_local,
                                           (size_t)_huffLog_local,nbStreams,oldHufTable,flags);
                        return sVar4;
                      }
                    }
                    if ((void *)((long)pvVar3 + 0xcU) < _huffLog_local) {
                      largestTotal = (long)pvVar3 + largestTotal;
                      if (repeat != (HUF_repeat *)0x0) {
                        *repeat = HUF_repeat_none;
                      }
                      if (oldHufTable != (HUF_CElt *)0x0) {
                        memcpy(oldHufTable,ostart + 0x400,0x808);
                      }
                      dst_local = (void *)HUF_compressCTable_internal
                                                    (oend,(BYTE *)largestTotal,op,
                                                     (void *)srcSize_local,(size_t)_huffLog_local,
                                                     nbStreams,(HUF_CElt *)(ostart + 0x400),flags);
                    }
                    else {
                      dst_local = (void *)0x0;
                    }
                  }
                }
              }
              else {
                dst_local = (void *)HUF_compressCTable_internal
                                              (oend,(BYTE *)largestTotal,op,(void *)srcSize_local,
                                               (size_t)_huffLog_local,nbStreams,oldHufTable,flags);
              }
            }
            else {
              dst_local = (void *)0x0;
            }
          }
        }
        else {
          dst_local = (void *)HUF_compressCTable_internal
                                        ((BYTE *)dstSize_local,(BYTE *)dstSize_local,op,
                                         (void *)srcSize_local,(size_t)_huffLog_local,nbStreams,
                                         oldHufTable,flags);
        }
      }
      else {
        dst_local = (void *)0xffffffffffffffd2;
      }
    }
    else {
      dst_local = (void *)0xffffffffffffffd4;
    }
  }
  else {
    dst_local = (void *)0xffffffffffffffb8;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}